

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.cpp
# Opt level: O1

void __thiscall options::options(options *this,uint argc,char **argv)

{
  string *psVar1;
  string *psVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  char **ppcVar6;
  string *psVar7;
  uint uVar8;
  char *__end;
  
  this->prec = 0xf;
  psVar7 = &this->Ja;
  (this->Ja)._M_dataplus._M_p = (pointer)&(this->Ja).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar7,"1","");
  psVar1 = &this->Jb;
  (this->Jb)._M_dataplus._M_p = (pointer)&(this->Jb).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar1,"1","");
  psVar2 = &this->Jc;
  (this->Jc)._M_dataplus._M_p = (pointer)&(this->Jc).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar2,"1","");
  (this->Tmin)._M_dataplus._M_p = (pointer)&(this->Tmin).field_2;
  (this->Tmin)._M_string_length = 0;
  (this->Tmin).field_2._M_local_buf[0] = '\0';
  (this->Tmax)._M_dataplus._M_p = (pointer)&(this->Tmax).field_2;
  (this->Tmax)._M_string_length = 0;
  (this->Tmax).field_2._M_local_buf[0] = '\0';
  (this->dT)._M_dataplus._M_p = (pointer)&(this->dT).field_2;
  (this->dT)._M_string_length = 0;
  (this->dT).field_2._M_local_buf[0] = '\0';
  this->valid = true;
  if (argc != 0) {
    if (argc == 1) {
switchD_00108bcb_caseD_3:
      this->valid = false;
    }
    else {
      uVar8 = 0;
      do {
        pcVar3 = argv[uVar8 + 1];
        if (*pcVar3 != '-') {
          switch(~uVar8 + argc) {
          case 1:
            std::__cxx11::string::_M_replace
                      ((ulong)psVar2,0,(char *)(this->Jc)._M_string_length,0x15a5d7);
            std::__cxx11::string::_M_assign((string *)psVar1);
            std::__cxx11::string::_M_assign((string *)psVar7);
            ppcVar6 = argv + (uVar8 + 1);
            break;
          case 2:
            pcVar4 = (char *)(this->Jc)._M_string_length;
            strlen(pcVar3);
            std::__cxx11::string::_M_replace((ulong)psVar2,0,pcVar4,(ulong)pcVar3);
            std::__cxx11::string::_M_assign((string *)psVar1);
            std::__cxx11::string::_M_assign((string *)psVar7);
            ppcVar6 = argv + (uVar8 + 2);
            break;
          default:
            goto switchD_00108bcb_caseD_3;
          case 4:
            pcVar4 = (char *)(this->Ja)._M_string_length;
            strlen(pcVar3);
            std::__cxx11::string::_M_replace((ulong)psVar7,0,pcVar4,(ulong)pcVar3);
            pcVar3 = argv[uVar8 + 2];
            pcVar4 = (char *)(this->Jb)._M_string_length;
            strlen(pcVar3);
            std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar4,(ulong)pcVar3);
            pcVar3 = argv[uVar8 + 3];
            pcVar4 = (char *)(this->Jc)._M_string_length;
            strlen(pcVar3);
            std::__cxx11::string::_M_replace((ulong)psVar2,0,pcVar4,(ulong)pcVar3);
            ppcVar6 = argv + (uVar8 + 4);
            break;
          case 6:
            pcVar4 = (char *)(this->Ja)._M_string_length;
            strlen(pcVar3);
            std::__cxx11::string::_M_replace((ulong)psVar7,0,pcVar4,(ulong)pcVar3);
            pcVar3 = argv[uVar8 + 2];
            pcVar4 = (char *)(this->Jb)._M_string_length;
            strlen(pcVar3);
            std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar4,(ulong)pcVar3);
            pcVar3 = argv[uVar8 + 3];
            pcVar4 = (char *)(this->Jc)._M_string_length;
            strlen(pcVar3);
            std::__cxx11::string::_M_replace((ulong)psVar2,0,pcVar4,(ulong)pcVar3);
            pcVar3 = argv[uVar8 + 4];
            pcVar4 = (char *)(this->Tmin)._M_string_length;
            strlen(pcVar3);
            std::__cxx11::string::_M_replace((ulong)&this->Tmin,0,pcVar4,(ulong)pcVar3);
            pcVar3 = argv[uVar8 + 5];
            pcVar4 = (char *)(this->Tmax)._M_string_length;
            strlen(pcVar3);
            std::__cxx11::string::_M_replace((ulong)&this->Tmax,0,pcVar4,(ulong)pcVar3);
            pcVar3 = argv[uVar8 + 6];
            pcVar4 = (char *)(this->dT)._M_string_length;
            strlen(pcVar3);
            std::__cxx11::string::_M_replace((ulong)&this->dT,0,pcVar4,(ulong)pcVar3);
            return;
          }
          pcVar3 = *ppcVar6;
          pcVar4 = (char *)(this->dT)._M_string_length;
          strlen(pcVar3);
          std::__cxx11::string::_M_replace((ulong)&this->dT,0,pcVar4,(ulong)pcVar3);
          std::__cxx11::string::_M_assign((string *)&this->Tmax);
          std::__cxx11::string::_M_assign((string *)&this->Tmin);
          return;
        }
        if ((pcVar3[1] != 'p') || (argc - 2 == uVar8)) goto switchD_00108bcb_caseD_3;
        uVar5 = atoi(argv[uVar8 + 2]);
        this->prec = uVar5;
        uVar5 = uVar8 + 3;
        uVar8 = uVar8 + 2;
      } while (uVar5 < argc);
    }
  }
  return;
}

Assistant:

options(unsigned int argc, char *argv[])
      : prec(15), Ja("1"), Jb("1"), Jc("1"), valid(true) {
    if (argc == 1) {
      valid = false;
      return;
    }
    for (unsigned i = 1; i < argc; ++i) {
      switch (argv[i][0]) {
        case '-':
          switch (argv[i][1]) {
            case 'p':
              if (++i == argc) {
                valid = false;
                return;
              }
              prec = std::atoi(argv[i]);
              break;
            default:
              valid = false;
              return;
          }
          break;
        default:
          switch (argc - i) {
            case 1:
              Ja = Jb = Jc = "1";
              Tmin = Tmax = dT = argv[i];
              return;
            case 2:
              Ja = Jb = Jc = argv[i];
              Tmin = Tmax = dT = argv[i + 1];
              return;
            case 4:
              Ja = argv[i];
              Jb = argv[i + 1];
              Jc = argv[i + 2];
              Tmin = Tmax = dT = argv[i + 3];
              return;
            case 6:
              Ja = argv[i];
              Jb = argv[i + 1];
              Jc = argv[i + 2];
              Tmin = argv[i + 3];
              Tmax = argv[i + 4];
              dT = argv[i + 5];
              return;
            default:
              valid = false;
              return;
          }
      }
    }
  }